

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.c
# Opt level: O0

int cmdline_read(CMDLINE_OPTION *options,int argc,char **argv,
                _func_int_int_char_ptr_void_ptr *callback,void *userdata)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  code *in_RCX;
  long in_RDX;
  int in_ESI;
  char *in_RDI;
  undefined8 in_R8;
  size_t len_2;
  char *assignment;
  char *badoptname;
  size_t len_1;
  size_t len;
  int ret;
  int i;
  int after_doubledash;
  int fast_optarg_decision;
  char auxbuf [33];
  CMDLINE_OPTION *opt;
  size_t local_a0;
  char *in_stack_ffffffffffffff68;
  _func_int_int_char_ptr_void_ptr *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  CMDLINE_OPTION *in_stack_ffffffffffffff80;
  int local_78;
  int local_74;
  undefined1 local_68 [32];
  undefined1 local_48;
  char *local_38;
  undefined8 local_30;
  code *local_28;
  long local_20;
  int local_14;
  char *local_10;
  
  bVar1 = true;
  bVar2 = false;
  local_74 = 1;
  local_78 = 0;
  local_48 = 0;
  for (local_38 = in_RDI; local_30 = in_R8, local_28 = in_RCX, local_20 = in_RDX, local_14 = in_ESI,
      local_10 = in_RDI, *(int *)(local_38 + 0x10) != 0; local_38 = local_38 + 0x18) {
    if (((*(uint *)(local_38 + 0x14) & 4) != 0) && (**(char **)(local_38 + 8) != '-')) {
      bVar1 = false;
    }
  }
  do {
    if (local_14 <= local_74) {
      return local_78;
    }
    if ((bVar2) || (iVar3 = strcmp(*(char **)(local_20 + (long)local_74 * 8),"-"), iVar3 == 0)) {
      local_78 = (*local_28)(0,*(undefined8 *)(local_20 + (long)local_74 * 8),local_30);
    }
    else {
      iVar3 = strcmp(*(char **)(local_20 + (long)local_74 * 8),"--");
      if (iVar3 == 0) {
        bVar2 = true;
      }
      else if ((bVar1) && (**(char **)(local_20 + (long)local_74 * 8) != '-')) {
        local_78 = (*local_28)(0,*(undefined8 *)(local_20 + (long)local_74 * 8),local_30);
      }
      else {
        for (local_38 = local_10; *(int *)(local_38 + 0x10) != 0; local_38 = local_38 + 0x18) {
          if ((*(uint *)(local_38 + 0x14) & 4) == 0) {
            if ((*(long *)(local_38 + 8) == 0) ||
               (iVar3 = strncmp(*(char **)(local_20 + (long)local_74 * 8),"--",2), iVar3 != 0)) {
              if ((*local_38 != '\0') &&
                 ((**(char **)(local_20 + (long)local_74 * 8) == '-' &&
                  (*(char *)(*(long *)(local_20 + (long)local_74 * 8) + 1) == *local_38)))) {
                if ((*(uint *)(local_38 + 0x14) & 2) == 0) {
                  local_78 = (*local_28)(*(undefined4 *)(local_38 + 0x10),0,local_30);
                  if ((local_78 == 0) &&
                     (*(char *)(*(long *)(local_20 + (long)local_74 * 8) + 2) != '\0')) {
                    local_78 = cmdline_handle_short_opt_group
                                         (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                                          in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
                  }
                }
                else if (*(char *)(*(long *)(local_20 + (long)local_74 * 8) + 2) == '\0') {
                  if (local_74 + 1 < local_14) {
                    local_74 = local_74 + 1;
                    local_78 = (*local_28)(*(undefined4 *)(local_38 + 0x10),
                                           *(undefined8 *)(local_20 + (long)local_74 * 8),local_30);
                  }
                  else {
                    local_78 = (*local_28)(0x80000002,*(undefined8 *)(local_20 + (long)local_74 * 8)
                                           ,local_30);
                  }
                }
                else {
                  local_78 = (*local_28)(*(undefined4 *)(local_38 + 0x10),
                                         *(long *)(local_20 + (long)local_74 * 8) + 2,local_30);
                }
                break;
              }
            }
            else {
              in_stack_ffffffffffffff78 = (char *)strlen(*(char **)(local_38 + 8));
              iVar3 = strncmp((char *)(*(long *)(local_20 + (long)local_74 * 8) + 2),
                              *(char **)(local_38 + 8),(size_t)in_stack_ffffffffffffff78);
              if (iVar3 == 0) {
                if (in_stack_ffffffffffffff78[*(long *)(local_20 + (long)local_74 * 8) + 2] == '\0')
                {
                  if ((*(uint *)(local_38 + 0x14) & 2) == 0) {
                    local_78 = (*local_28)(*(undefined4 *)(local_38 + 0x10),0,local_30);
                  }
                  else {
                    local_78 = (*local_28)(0x80000002,*(undefined8 *)(local_20 + (long)local_74 * 8)
                                           ,local_30);
                  }
                  break;
                }
                if (in_stack_ffffffffffffff78[*(long *)(local_20 + (long)local_74 * 8) + 2] == '=')
                {
                  if ((*(uint *)(local_38 + 0x14) & 3) == 0) {
                    snprintf(local_68,0x20,"--%s",*(undefined8 *)(local_38 + 8));
                    local_78 = (*local_28)(0x80000003,local_68,local_30);
                  }
                  else {
                    local_78 = (*local_28)(*(undefined4 *)(local_38 + 0x10),
                                           in_stack_ffffffffffffff78 +
                                           *(long *)(local_20 + (long)local_74 * 8) + 3,local_30);
                  }
                  break;
                }
              }
            }
          }
          else {
            in_stack_ffffffffffffff80 = (CMDLINE_OPTION *)strlen(*(char **)(local_38 + 8));
            iVar3 = strncmp(*(char **)(local_20 + (long)local_74 * 8),*(char **)(local_38 + 8),
                            (size_t)in_stack_ffffffffffffff80);
            if (iVar3 == 0) {
              if ((&in_stack_ffffffffffffff80->shortname)[*(long *)(local_20 + (long)local_74 * 8)]
                  == '\0') {
                if (local_74 + 1 < local_14) {
                  local_74 = local_74 + 1;
                  local_78 = (*local_28)(*(undefined4 *)(local_38 + 0x10),
                                         *(undefined8 *)(local_20 + (long)local_74 * 8),local_30);
                }
                else {
                  local_78 = (*local_28)(0x80000002,*(undefined8 *)(local_38 + 8),local_30);
                }
              }
              else {
                local_78 = (*local_28)(*(undefined4 *)(local_38 + 0x10),
                                       &in_stack_ffffffffffffff80->shortname +
                                       *(long *)(local_20 + (long)local_74 * 8),local_30);
              }
              break;
            }
          }
        }
        if (*(int *)(local_38 + 0x10) == 0) {
          if (**(char **)(local_20 + (long)local_74 * 8) == '-') {
            in_stack_ffffffffffffff70 =
                 *(_func_int_int_char_ptr_void_ptr **)(local_20 + (long)local_74 * 8);
            iVar3 = strncmp((char *)in_stack_ffffffffffffff70,"--",2);
            if ((iVar3 == 0) &&
               (in_stack_ffffffffffffff68 = strchr((char *)in_stack_ffffffffffffff70,0x3d),
               in_stack_ffffffffffffff68 != (char *)0x0)) {
              local_a0 = (long)in_stack_ffffffffffffff68 - (long)in_stack_ffffffffffffff70;
              if (0x20 < local_a0) {
                local_a0 = 0x20;
              }
              strncpy(local_68,(char *)in_stack_ffffffffffffff70,local_a0);
              local_68[local_a0] = 0;
              in_stack_ffffffffffffff70 = (_func_int_int_char_ptr_void_ptr *)local_68;
            }
            local_78 = (*local_28)(0x80000001,in_stack_ffffffffffffff70,local_30);
          }
          else {
            local_78 = (*local_28)(0,*(undefined8 *)(local_20 + (long)local_74 * 8),local_30);
          }
        }
      }
    }
    if (local_78 != 0) {
      return local_78;
    }
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

int
cmdline_read(const CMDLINE_OPTION* options, int argc, char** argv,
        int (*callback)(int /*optval*/, const char* /*arg*/, void* /*userdata*/),
        void* userdata)
{
    const CMDLINE_OPTION* opt;
    char auxbuf[CMDLINE_AUXBUF_SIZE+1];
    int fast_optarg_decision = 1;
    int after_doubledash = 0;
    int i = 1;
    int ret = 0;

    auxbuf[CMDLINE_AUXBUF_SIZE] = '\0';

    /* Check whether there is any CMDLINE_OPTFLAG_COMPILERLIKE option with
     * a name not starting with '-'. That would imply we can to check for
     * non-option arguments only after refusing all such options. */
    for(opt = options; opt->id != 0; opt++) {
        if((opt->flags & CMDLINE_OPTFLAG_COMPILERLIKE)  &&  opt->longname[0] != '-')
            fast_optarg_decision = 0;
    }

    while(i < argc) {
        if(after_doubledash  ||  strcmp(argv[i], "-") == 0) {
            /* Non-option argument.
             * Standalone "-" usually means "read from stdin" or "write to
             * stdout" so treat it always as a non-option. */
            ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
        } else if(strcmp(argv[i], "--") == 0) {
            /* End of options. All the remaining tokens are non-options
             * even if they start with a dash. */
            after_doubledash = 1;
        } else if(fast_optarg_decision  &&  argv[i][0] != '-') {
            /* Non-option argument. */
            ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
        } else {
            for(opt = options; opt->id != 0; opt++) {
                if(opt->flags & CMDLINE_OPTFLAG_COMPILERLIKE) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i], opt->longname, len) == 0) {
                        /* Compiler-like option. */
                        if(argv[i][len] != '\0')
                            ret = callback(opt->id, argv[i] + len, userdata);
                        else if(i+1 < argc)
                            ret = callback(opt->id, argv[++i], userdata);
                        else
                            ret = callback(CMDLINE_OPTID_MISSINGARG, opt->longname, userdata);
                        break;
                    }
                } else if(opt->longname != NULL  &&  strncmp(argv[i], "--", 2) == 0) {
                    size_t len = strlen(opt->longname);
                    if(strncmp(argv[i]+2, opt->longname, len) == 0) {
                        /* Regular long option. */
                        if(argv[i][2+len] == '\0') {
                            /* with no argument provided. */
                            if(!(opt->flags & CMDLINE_OPTFLAG_REQUIREDARG))
                                ret = callback(opt->id, NULL, userdata);
                            else
                                ret = callback(CMDLINE_OPTID_MISSINGARG, argv[i], userdata);
                            break;
                        } else if(argv[i][2+len] == '=') {
                            /* with an argument provided. */
                            if(opt->flags & (CMDLINE_OPTFLAG_OPTIONALARG | CMDLINE_OPTFLAG_REQUIREDARG)) {
                                ret = callback(opt->id, argv[i]+2+len+1, userdata);
                            } else {
                                snprintf(auxbuf, CMDLINE_AUXBUF_SIZE, "--%s", opt->longname);
                                ret = callback(CMDLINE_OPTID_BOGUSARG, auxbuf, userdata);
                            }
                            break;
                        } else {
                            continue;
                        }
                    }
                } else if(opt->shortname != '\0'  &&  argv[i][0] == '-') {
                    if(argv[i][1] == opt->shortname) {
                        /* Regular short option. */
                        if(opt->flags & CMDLINE_OPTFLAG_REQUIREDARG) {
                            if(argv[i][2] != '\0')
                                ret = callback(opt->id, argv[i]+2, userdata);
                            else if(i+1 < argc)
                                ret = callback(opt->id, argv[++i], userdata);
                            else
                                ret = callback(CMDLINE_OPTID_MISSINGARG, argv[i], userdata);
                            break;
                        } else {
                            ret = callback(opt->id, NULL, userdata);

                            /* There might be more (argument-less) short options
                             * grouped together. */
                            if(ret == 0  &&  argv[i][2] != '\0')
                                ret = cmdline_handle_short_opt_group(options, argv[i]+2, callback, userdata);
                            break;
                        }
                    }
                }
            }

            if(opt->id == 0) {  /* still not handled? */
                if(argv[i][0] != '-') {
                    /* Non-option argument. */
                    ret = callback(CMDLINE_OPTID_NONE, argv[i], userdata);
                } else {
                    /* Unknown option. */
                    char* badoptname = argv[i];

                    if(strncmp(badoptname, "--", 2) == 0) {
                        /* Strip any argument from the long option. */
                        char* assignment = strchr(badoptname, '=');
                        if(assignment != NULL) {
                            size_t len = assignment - badoptname;
                            if(len > CMDLINE_AUXBUF_SIZE)
                                len = CMDLINE_AUXBUF_SIZE;
                            strncpy(auxbuf, badoptname, len);
                            auxbuf[len] = '\0';
                            badoptname = auxbuf;
                        }
                    }

                    ret = callback(CMDLINE_OPTID_UNKNOWN, badoptname, userdata);
                }
            }
        }

        if(ret != 0)
            return ret;
        i++;
    }

    return ret;
}